

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContentLeafNameTypeVector.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::ContentLeafNameTypeVector::ContentLeafNameTypeVector
          (ContentLeafNameTypeVector *this,ContentLeafNameTypeVector *toCopy)

{
  MemoryManager *pMVar1;
  int iVar2;
  NodeTypes NVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  QName *pQVar4;
  XMLSize_t XVar5;
  
  pMVar1 = toCopy->fMemoryManager;
  this->fMemoryManager = pMVar1;
  this->fLeafNames = (QName **)0x0;
  this->fLeafTypes = (NodeTypes *)0x0;
  this->fLeafCount = 0;
  XVar5 = toCopy->fLeafCount;
  this->fLeafCount = XVar5;
  iVar2 = (*pMVar1->_vptr_MemoryManager[3])(pMVar1,XVar5 * 8);
  this->fLeafNames = (QName **)CONCAT44(extraout_var,iVar2);
  iVar2 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,XVar5 * 4);
  this->fLeafTypes = (NodeTypes *)CONCAT44(extraout_var_00,iVar2);
  this->fLeafCount = XVar5;
  if (XVar5 != 0) {
    XVar5 = 0;
    do {
      pQVar4 = getLeafNameAt(toCopy,XVar5);
      this->fLeafNames[XVar5] = pQVar4;
      NVar3 = getLeafTypeAt(toCopy,XVar5);
      this->fLeafTypes[XVar5] = NVar3;
      XVar5 = XVar5 + 1;
    } while (XVar5 < this->fLeafCount);
  }
  return;
}

Assistant:

ContentLeafNameTypeVector::ContentLeafNameTypeVector
(
    const ContentLeafNameTypeVector& toCopy
)
: XMemory(toCopy)
, fMemoryManager(toCopy.fMemoryManager)
, fLeafNames(0)
, fLeafTypes(0)
, fLeafCount(0)
{
    fLeafCount=toCopy.getLeafCount();
    init(fLeafCount);

    for (XMLSize_t i=0; i<this->fLeafCount; i++)
    {
        fLeafNames[i] = toCopy.getLeafNameAt(i);
        fLeafTypes[i] = toCopy.getLeafTypeAt(i);
    }
}